

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_TestShell::createTest
          (TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_TestShell
           *this)

{
  Utest *this_00;
  TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x233);
  TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_Test::
  TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_Test
            ((TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_Test *)
             this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersButExpectedParameterDidntHappen)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("p1", 1).ignoreOtherParameters();
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters();
    mock().actualCall("foo").withParameter("p2", 2).withParameter("p3", 3).withParameter("p4", 4);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}